

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Output::mapTag(Output *this,StringRef Tag,bool Use)

{
  StringRef s;
  bool bVar1;
  size_t sVar2;
  reference pIVar3;
  bool local_71;
  StringRef local_68;
  InState local_54;
  Output *local_50;
  char *local_48;
  StringRef local_40;
  InState *local_30;
  InState *E;
  bool SequenceElement;
  Output *pOStack_20;
  bool Use_local;
  Output *this_local;
  StringRef Tag_local;
  
  Tag_local.Data = (char *)Tag.Length;
  this_local = (Output *)Tag.Data;
  E._7_1_ = Use;
  if (Use) {
    E._6_1_ = 0;
    pOStack_20 = this;
    sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
    if (1 < sVar2) {
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
      local_30 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                           ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                            &this->StateStack,sVar2 - 2);
      bVar1 = inSeqAnyElement(*local_30);
      local_71 = true;
      if (!bVar1) {
        local_71 = inFlowSeqAnyElement(*local_30);
      }
      E._6_1_ = local_71;
    }
    if (((E._6_1_ & 1) == 0) ||
       (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                           ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                            &this->StateStack), *pIVar3 != inMapFirstKey)) {
      StringRef::StringRef(&local_40," ");
      output(this,local_40);
    }
    else {
      newLineCheck(this);
    }
    local_50 = this_local;
    local_48 = Tag_local.Data;
    s.Length = (size_t)Tag_local.Data;
    s.Data = (char *)this_local;
    output(this,s);
    if ((E._6_1_ & 1) != 0) {
      pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack);
      if (*pIVar3 == inMapFirstKey) {
        SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::pop_back
                  ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack);
        local_54 = inMapOtherKey;
        SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
                   &local_54);
      }
      StringRef::StringRef(&local_68,"\n");
      (this->Padding).Data = local_68.Data;
      (this->Padding).Length = local_68.Length;
    }
  }
  return (bool)(E._7_1_ & 1);
}

Assistant:

bool Output::mapTag(StringRef Tag, bool Use) {
  if (Use) {
    // If this tag is being written inside a sequence we should write the start
    // of the sequence before writing the tag, otherwise the tag won't be
    // attached to the element in the sequence, but rather the sequence itself.
    bool SequenceElement = false;
    if (StateStack.size() > 1) {
      auto &E = StateStack[StateStack.size() - 2];
      SequenceElement = inSeqAnyElement(E) || inFlowSeqAnyElement(E);
    }
    if (SequenceElement && StateStack.back() == inMapFirstKey) {
      newLineCheck();
    } else {
      output(" ");
    }
    output(Tag);
    if (SequenceElement) {
      // If we're writing the tag during the first element of a map, the tag
      // takes the place of the first element in the sequence.
      if (StateStack.back() == inMapFirstKey) {
        StateStack.pop_back();
        StateStack.push_back(inMapOtherKey);
      }
      // Tags inside maps in sequences should act as keys in the map from a
      // formatting perspective, so we always want a newline in a sequence.
      Padding = "\n";
    }
  }
  return Use;
}